

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_expression::translate
          (method_expression *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  tree_node *ptVar1;
  _Elt_pointer pdVar2;
  int iVar3;
  token_base **pptVar4;
  statement_expression *this_00;
  _Elt_pointer pptVar5;
  context_t *size;
  token_base *t;
  tree_type<cs::token_base_*> local_40;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_38;
  iterator local_28;
  
  t = *(((raw->
         super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
         )._M_impl.super__Deque_impl_data._M_start._M_cur)->
       super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
       super__Deque_impl_data._M_start._M_cur + 1;
  size = context;
  if ((((((context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        compiler).super___shared_ptr<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       fold_expr == true) && (ptVar1 = (tree_node *)t->_vptr_token_base, ptVar1 != (tree_node *)0x0)
     ) {
    local_28.mData = ptVar1;
    pptVar4 = tree_type<cs::token_base_*>::iterator::data(&local_28);
    iVar3 = (*(*pptVar4)->_vptr_token_base[2])();
    if (iVar3 == 7) {
      return (statement_base *)0x0;
    }
  }
  this_00 = (statement_expression *)
            statement_base::operator_new((statement_base *)0x28,(size_t)size);
  tree_type<cs::token_base_*>::tree_type(&local_40,(tree_type<cs::token_base_*> *)t);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar2 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar5 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar5 ==
      (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar5 = (pdVar2->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_expression::statement_expression(this_00,&local_40,(context_t *)&local_38,pptVar5[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  tree_type<cs::token_base_*>::~tree_type(&local_40);
  return &this_00->super_statement_base;
}

Assistant:

statement_base *
	method_expression::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().front())->get_tree();
		if (context->compiler->fold_expr && tree.root().usable() &&
		        tree.root().data()->get_type() == token_types::value)
			return nullptr;
		else
			return new statement_expression(tree, context, raw.front().back());
	}